

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O0

ktx_error_code_e
ktxTexture_CreateFromNamedFile(char *filename,ktxTextureCreateFlags createFlags,ktxTexture **newTex)

{
  FILE *file_00;
  long in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  FILE *file;
  ktxStream stream;
  ktx_error_code_e result;
  char *in_stack_ffffffffffffff68;
  ktxStream_read in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffffd8;
  ktxTextureCreateFlags createFlags_00;
  undefined4 in_stack_ffffffffffffffe8;
  ktx_error_code_e local_4;
  
  if ((in_RDI == 0) || (in_RDX == 0)) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    file_00 = ktxFOpenUTF8((char *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    createFlags_00 = (ktxTextureCreateFlags)((ulong)in_RDX >> 0x20);
    if (file_00 == (FILE *)0x0) {
      local_4 = KTX_FILE_OPEN_FAILED;
    }
    else {
      local_4 = ktxFileStream_construct((ktxStream *)&stack0xffffffffffffff70,file_00,true);
      if (local_4 == KTX_SUCCESS) {
        local_4 = ktxTexture_CreateFromStream
                            ((ktxStream *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),createFlags_00,
                             (ktxTexture **)(ulong)in_stack_ffffffffffffffd8);
      }
    }
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxTexture_CreateFromNamedFile(const char* const filename,
                               ktxTextureCreateFlags createFlags,
                               ktxTexture** newTex)
{
    KTX_error_code result;
    ktxStream stream;
    FILE* file;

    if (filename == NULL || newTex == NULL)
        return KTX_INVALID_VALUE;

    file = ktxFOpenUTF8(filename, "rb");
    if (!file)
       return KTX_FILE_OPEN_FAILED;

    result = ktxFileStream_construct(&stream, file, KTX_TRUE);
    if (result == KTX_SUCCESS) {
        result = ktxTexture_CreateFromStream(&stream, createFlags, newTex);
    }
    return result;
}